

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int tinyexr::ParseEXRHeader
              (HeaderInfo *info,bool *empty_header,EXRVersion *version,string *err,uchar *buf)

{
  byte bVar1;
  int iVar2;
  pointer p_Var3;
  int iVar4;
  uchar *puVar5;
  uchar *puVar6;
  reference __src;
  float *pfVar7;
  int *piVar8;
  char cVar9;
  int local_2c4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  int local_290;
  string attr_type;
  string attr_name;
  EXRAttribute attrib;
  
  if (empty_header != (bool *)0x0) {
    *empty_header = false;
  }
  if ((version->multipart == 0) || (*buf != '\0')) {
    info->display_window[2] = 0;
    info->display_window[3] = 0;
    info->screen_window_center[0] = 0.0;
    info->screen_window_center[1] = 0.0;
    info->line_order = 0;
    info->display_window[0] = 0;
    info->display_window[1] = 0;
    info->display_window[2] = 0;
    info->data_window[0] = 0;
    info->data_window[1] = 0;
    info->data_window[2] = 0;
    info->data_window[3] = 0;
    info->screen_window_width = -1.0;
    info->pixel_aspect_ratio = -1.0;
    info->tile_size_x = -1;
    info->tile_size_y = -1;
    info->tile_level_mode = -1;
    info->tile_rounding_mode = -1;
    p_Var3 = (info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl
        .super__Vector_impl_data._M_finish != p_Var3) {
      (info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
      super__Vector_impl_data._M_finish = p_Var3;
    }
    puVar6 = buf;
    do {
      attr_name._M_dataplus._M_p = (pointer)&attr_name.field_2;
      attr_name._M_string_length = 0;
      attr_name.field_2._M_local_buf[0] = '\0';
      attr_type._M_dataplus._M_p = (pointer)&attr_type.field_2;
      attr_type._M_string_length = 0;
      attr_type.field_2._M_local_buf[0] = '\0';
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      puVar5 = (uchar *)ReadAttribute(&attr_name,&attr_type,
                                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &data.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ,(char *)puVar6);
      if (puVar5 == (uchar *)0x0) {
        puVar5 = puVar6 + 1;
        cVar9 = '\x02';
        goto LAB_00122cb6;
      }
      if ((version->tiled == 0) ||
         (iVar4 = std::__cxx11::string::compare((char *)&attr_name), iVar4 != 0)) {
        iVar4 = std::__cxx11::string::compare((char *)&attr_name);
        if (iVar4 == 0) {
          if (*data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start < 5) {
            info->compression_type =
                 (uint)*data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
            goto LAB_00122cb0;
          }
          if (err == (string *)0x0) {
            cVar9 = '\x01';
            local_2c4 = -7;
            puVar5 = puVar6;
          }
          else {
            std::__cxx11::string::assign((char *)err);
            cVar9 = '\x01';
            local_2c4 = -7;
            puVar5 = puVar6;
          }
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)&attr_name);
          if (iVar4 != 0) {
            iVar4 = std::__cxx11::string::compare((char *)&attr_name);
            if (iVar4 == 0) {
              piVar8 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &data.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ,0);
              info->data_window[0] = *piVar8;
              piVar8 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &data.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ,4);
              info->data_window[1] = *piVar8;
              piVar8 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &data.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ,8);
              info->data_window[2] = *piVar8;
              piVar8 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &data.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ,0xc);
              info->data_window[3] = *piVar8;
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)&attr_name);
              if (iVar4 == 0) {
                piVar8 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           &data.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ,0);
                info->display_window[0] = *piVar8;
                piVar8 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           &data.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ,4);
                info->display_window[1] = *piVar8;
                piVar8 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           &data.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ,8);
                info->display_window[2] = *piVar8;
                piVar8 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           &data.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ,0xc);
                info->display_window[3] = *piVar8;
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)&attr_name);
                if (iVar4 == 0) {
                  info->line_order =
                       (uint)*data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)&attr_name);
                  if (iVar4 == 0) {
                    pfVar7 = (float *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                                ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&data.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ,0);
                    info->pixel_aspect_ratio = *pfVar7;
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare((char *)&attr_name);
                    if (iVar4 == 0) {
                      pfVar7 = (float *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                        at((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           &data.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ,0);
                      info->screen_window_center[0] = *pfVar7;
                      pfVar7 = (float *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                        at((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           &data.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ,4);
                      info->screen_window_center[1] = *pfVar7;
                    }
                    else {
                      iVar4 = std::__cxx11::string::compare((char *)&attr_name);
                      if (iVar4 == 0) {
                        pfVar7 = (float *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>
                                          ::at((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)&data.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ,0);
                        info->screen_window_width = *pfVar7;
                      }
                      else {
                        iVar4 = std::__cxx11::string::compare((char *)&attr_name);
                        if (iVar4 != 0) {
                          cVar9 = '\0';
                          if ((ulong)(((long)(info->attributes).
                                             super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(info->attributes).
                                            super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>
                                            ._M_impl.super__Vector_impl_data._M_start) / 0x210) <
                              0x80) {
                            strncpy(attrib.name,attr_name._M_dataplus._M_p,0xff);
                            attrib.name[0xff] = '\0';
                            strncpy(attrib.type,attr_type._M_dataplus._M_p,0xff);
                            attrib.type[0xff] = '\0';
                            attrib.size = (int)((long)data.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)data.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            puVar6 = (uchar *)malloc((long)data.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)data.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            attrib.value = puVar6;
                            __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                              ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)&data.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ,0);
                            memcpy(puVar6,__src,
                                   (long)data.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)data.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
                            std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::push_back
                                      (&info->attributes,&attrib);
                          }
                          goto LAB_00122cb6;
                        }
                        piVar8 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                        at((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           &data.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ,0);
                        info->chunk_count = *piVar8;
                      }
                    }
                  }
                }
              }
            }
            goto LAB_00122cb0;
          }
          ReadChannelInfo(&info->channels,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          cVar9 = (info->channels).
                  super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  (info->channels).
                  super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
          if ((bool)cVar9) {
            puVar5 = puVar6;
          }
          if ((bool)cVar9) {
            local_2c4 = -4;
          }
          if ((bool)cVar9 && err != (string *)0x0) {
            std::__cxx11::string::assign((char *)err);
            cVar9 = '\x01';
            puVar5 = puVar6;
            local_2c4 = -4;
          }
        }
      }
      else {
        piVar8 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ,0);
        iVar4 = *piVar8;
        piVar8 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ,4);
        iVar2 = *piVar8;
        bVar1 = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[8];
        info->tile_size_x = iVar4;
        info->tile_size_y = iVar2;
        info->tile_level_mode = bVar1 & 3;
        info->tile_rounding_mode = bVar1 >> 4 & 1;
LAB_00122cb0:
        cVar9 = '\0';
      }
LAB_00122cb6:
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::__cxx11::string::~string((string *)&attr_type);
      std::__cxx11::string::~string((string *)&attr_name);
      puVar6 = puVar5;
    } while (cVar9 == '\0');
    if (cVar9 == '\x02') {
      local_290 = (int)buf;
      info->header_len = (int)puVar5 - local_290;
      local_2c4 = 0;
    }
  }
  else {
    local_2c4 = 0;
    if (empty_header != (bool *)0x0) {
      *empty_header = true;
    }
  }
  return local_2c4;
}

Assistant:

static int ParseEXRHeader(HeaderInfo *info, bool *empty_header,
                          const EXRVersion *version, std::string *err,
                          const unsigned char *buf) {
  const char *marker = reinterpret_cast<const char *>(&buf[0]);

  if (empty_header) {
    (*empty_header) = false;
  }

  if (version->multipart) {
    if (marker[0] == '\0') {
      // End of header list.
      if (empty_header) {
        (*empty_header) = true;
      }
      return TINYEXR_SUCCESS;
    }
  }

  info->data_window[0] = 0;
  info->data_window[1] = 0;
  info->data_window[2] = 0;
  info->data_window[3] = 0;
  info->line_order = 0;  // @fixme
  info->display_window[0] = 0;
  info->display_window[1] = 0;
  info->display_window[2] = 0;
  info->display_window[3] = 0;
  info->screen_window_center[0] = 0.0f;
  info->screen_window_center[1] = 0.0f;
  info->screen_window_width = -1.0f;
  info->pixel_aspect_ratio = -1.0f;

  info->tile_size_x = -1;
  info->tile_size_y = -1;
  info->tile_level_mode = -1;
  info->tile_rounding_mode = -1;

  info->attributes.clear();

  // Read attributes
  for (;;) {
    std::string attr_name;
    std::string attr_type;
    std::vector<unsigned char> data;
    const char *marker_next =
        tinyexr::ReadAttribute(&attr_name, &attr_type, &data, marker);
    if (marker_next == NULL) {
      marker++;  // skip '\0'
      break;
    }

    if (version->tiled && attr_name.compare("tiles") == 0) {
      unsigned int x_size, y_size;
      unsigned char tile_mode;
      assert(data.size() == 9);
      memcpy(&x_size, &data.at(0), sizeof(int));
      memcpy(&y_size, &data.at(4), sizeof(int));
      tile_mode = data[8];
      tinyexr::swap4(&x_size);
      tinyexr::swap4(&y_size);

      info->tile_size_x = static_cast<int>(x_size);
      info->tile_size_y = static_cast<int>(y_size);

      // mode = levelMode + roundingMode * 16
      info->tile_level_mode = tile_mode & 0x3;
      info->tile_rounding_mode = (tile_mode >> 4) & 0x1;

    } else if (attr_name.compare("compression") == 0) {
      bool ok = false;
      if ((data[0] >= TINYEXR_COMPRESSIONTYPE_NONE) &&
          (data[0] < TINYEXR_COMPRESSIONTYPE_PIZ)) {
        ok = true;
      }

      if (data[0] == TINYEXR_COMPRESSIONTYPE_PIZ) {
#if TINYEXR_USE_PIZ
        ok = true;
#else
        if (err) {
          (*err) = "PIZ compression is not supported.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
#endif
      }

      if (data[0] == TINYEXR_COMPRESSIONTYPE_ZFP) {
#if TINYEXR_USE_ZFP
        ok = true;
#else
        if (err) {
          (*err) = "ZFP compression is not supported.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
#endif
      }

      if (!ok) {
        if (err) {
          (*err) = "Unknown compression type.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
      }

      info->compression_type = static_cast<int>(data[0]);

    } else if (attr_name.compare("channels") == 0) {
      // name: zero-terminated string, from 1 to 255 bytes long
      // pixel type: int, possible values are: UINT = 0 HALF = 1 FLOAT = 2
      // pLinear: unsigned char, possible values are 0 and 1
      // reserved: three chars, should be zero
      // xSampling: int
      // ySampling: int

      ReadChannelInfo(info->channels, data);

      if (info->channels.size() < 1) {
        if (err) {
          (*err) = "# of channels is zero.";
        }
        return TINYEXR_ERROR_INVALID_DATA;
      }

    } else if (attr_name.compare("dataWindow") == 0) {
      memcpy(&info->data_window[0], &data.at(0), sizeof(int));
      memcpy(&info->data_window[1], &data.at(4), sizeof(int));
      memcpy(&info->data_window[2], &data.at(8), sizeof(int));
      memcpy(&info->data_window[3], &data.at(12), sizeof(int));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&info->data_window[0]));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&info->data_window[1]));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&info->data_window[2]));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&info->data_window[3]));
    } else if (attr_name.compare("displayWindow") == 0) {
      memcpy(&info->display_window[0], &data.at(0), sizeof(int));
      memcpy(&info->display_window[1], &data.at(4), sizeof(int));
      memcpy(&info->display_window[2], &data.at(8), sizeof(int));
      memcpy(&info->display_window[3], &data.at(12), sizeof(int));
      tinyexr::swap4(
          reinterpret_cast<unsigned int *>(&info->display_window[0]));
      tinyexr::swap4(
          reinterpret_cast<unsigned int *>(&info->display_window[1]));
      tinyexr::swap4(
          reinterpret_cast<unsigned int *>(&info->display_window[2]));
      tinyexr::swap4(
          reinterpret_cast<unsigned int *>(&info->display_window[3]));
    } else if (attr_name.compare("lineOrder") == 0) {
      info->line_order = static_cast<int>(data[0]);
    } else if (attr_name.compare("pixelAspectRatio") == 0) {
      memcpy(&info->pixel_aspect_ratio, &data.at(0), sizeof(float));
      tinyexr::swap4(
          reinterpret_cast<unsigned int *>(&info->pixel_aspect_ratio));
    } else if (attr_name.compare("screenWindowCenter") == 0) {
      memcpy(&info->screen_window_center[0], &data.at(0), sizeof(float));
      memcpy(&info->screen_window_center[1], &data.at(4), sizeof(float));
      tinyexr::swap4(
          reinterpret_cast<unsigned int *>(&info->screen_window_center[0]));
      tinyexr::swap4(
          reinterpret_cast<unsigned int *>(&info->screen_window_center[1]));
    } else if (attr_name.compare("screenWindowWidth") == 0) {
      memcpy(&info->screen_window_width, &data.at(0), sizeof(float));
      tinyexr::swap4(
          reinterpret_cast<unsigned int *>(&info->screen_window_width));

    } else if (attr_name.compare("chunkCount") == 0) {
      memcpy(&info->chunk_count, &data.at(0), sizeof(int));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&info->chunk_count));
    } else {
      // Custom attribute(up to TINYEXR_MAX_ATTRIBUTES)
      if (info->attributes.size() < TINYEXR_MAX_ATTRIBUTES) {
        EXRAttribute attrib;
        strncpy(attrib.name, attr_name.c_str(), 255);
        attrib.name[255] = '\0';
        strncpy(attrib.type, attr_type.c_str(), 255);
        attrib.type[255] = '\0';
        attrib.size = static_cast<int>(data.size());
        attrib.value = static_cast<unsigned char *>(malloc(data.size()));
        memcpy(reinterpret_cast<char *>(attrib.value), &data.at(0),
               data.size());
        info->attributes.push_back(attrib);
      }
    }

    marker = marker_next;
  }

  info->header_len = static_cast<unsigned int>(
      reinterpret_cast<const unsigned char *>(marker) - buf);

  return TINYEXR_SUCCESS;
}